

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<capnp::_::(anonymous_namespace)::UnionState&>
          (String *__return_storage_ptr__,kj *this,UnionState *params)

{
  char *in_RCX;
  char (*in_stack_ffffffffffffffa8) [2];
  Array<char> local_50;
  Array<char> local_38;
  
  strArray<unsigned_int_const(&)[4]>((String *)&local_50,this,(uint (*) [4])0x2d16bc,in_RCX);
  str<char_const(&)[13],kj::String,char_const(&)[4],int_const&,char_const(&)[2]>
            ((String *)&local_38,(kj *)"UnionState({",(char (*) [13])&local_50,(String *)"}, ",
             (char (*) [4])(this + 0x10),(int *)0x2c50d2,in_stack_ffffffffffffffa8);
  Array<char>::~Array(&local_50);
  (__return_storage_ptr__->content).ptr = local_38.ptr;
  (__return_storage_ptr__->content).size_ = local_38.size_;
  (__return_storage_ptr__->content).disposer = local_38.disposer;
  local_38.ptr = (char *)0x0;
  local_38.size_ = 0;
  Array<char>::~Array(&local_38);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}